

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_time.cpp
# Opt level: O0

Am_Time __thiscall Am_Time::operator-(Am_Time *this,Am_Time *other)

{
  long lVar1;
  long *in_RDX;
  long total_usec;
  Am_Time *other_local;
  Am_Time *this_local;
  Am_Time *rt;
  
  Am_Time(this);
  lVar1 = ((other->data->time).tv_usec + 1000000) - *(long *)(*in_RDX + 0x18);
  (this->data->time).tv_sec =
       ((other->data->time).tv_sec - *(long *)(*in_RDX + 0x10)) + -1 + lVar1 / 1000000;
  (this->data->time).tv_usec = lVar1 % 1000000;
  return (Am_Time)(Am_Time_Data *)this;
}

Assistant:

Am_Time
Am_Time::operator-(const Am_Time &other) const
{
  Am_Time rt;
  long total_usec = 1000000 + data->time.tv_usec - other.data->time.tv_usec;
  rt.data->time.tv_sec = (data->time.tv_sec) - (other.data->time.tv_sec) - 1 +
                         (total_usec / 1000000); // borrow
  rt.data->time.tv_usec = (total_usec % 1000000);
  return rt;
}